

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  int *piVar1;
  pointer pbVar2;
  AssertHelperData *pAVar3;
  bool bVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ulong uVar6;
  ostream *poVar7;
  char *(*extraout_RDX) [8];
  char *(*extraout_RDX_00) [8];
  char *(*extraout_RDX_01) [8];
  char *(*array) [8];
  undefined1 *this;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  size_t i;
  ulong uVar10;
  allocator<char> local_c1;
  AssertHelper local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  AssertHelperData *local_a0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  ostream *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  string local_70;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,(test_property->key_)._M_dataplus._M_p,&local_c1);
  bVar4 = std::operator==(xml_element,"testsuites");
  if (bVar4) {
    this = kReservedTestSuitesAttributes;
    array = extraout_RDX;
  }
  else {
    bVar4 = std::operator==(xml_element,"testsuite");
    if (bVar4) {
      this = kReservedTestSuiteAttributes;
      array = extraout_RDX_00;
    }
    else {
      bVar4 = std::operator==(xml_element,"testcase");
      if (!bVar4) {
        internal::GTestLog::GTestLog
                  ((GTestLog *)&local_70,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Asyc[P]SocketSys/libs/gtest/googletest/src/gtest.cc"
                   ,0x8f9);
        poVar7 = std::operator<<((ostream *)&std::cerr,"Condition false failed. ");
        poVar7 = std::operator<<(poVar7,"Unrecognized xml_element provided: ");
        std::operator<<(poVar7,(string *)xml_element);
        internal::GTestLog::~GTestLog((GTestLog *)&local_70);
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        goto LAB_00112894;
      }
      this = kReservedTestCaseAttributes;
      array = extraout_RDX_01;
    }
  }
  ArrayAsVector<8ul>(&local_b8,(testing *)this,array);
LAB_00112894:
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_50);
  pbVar2 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var5._M_current !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_90);
    local_98 = local_90._M_head_impl;
    poVar7 = (ostream *)(local_90._M_head_impl + 0x10);
    std::operator<<(poVar7,"Reserved key used in RecordProperty(): ");
    std::operator<<(poVar7,local_50);
    std::operator<<(poVar7," (");
    local_80 = pbVar2;
    local_88 = poVar7;
    local_78 = _Var5._M_current;
    Message::Message((Message *)&local_c0);
    local_a0 = local_c0.data_;
    piVar1 = &(local_c0.data_)->line;
    lVar8 = 0;
    for (uVar10 = 0; pAVar3 = local_a0,
        uVar6 = (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5, uVar10 < uVar6;
        uVar10 = uVar10 + 1) {
      if ((uVar10 != 0) && (2 < uVar6)) {
        std::operator<<((ostream *)piVar1,", ");
        uVar6 = (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      if (uVar10 == uVar6 - 1) {
        std::operator<<((ostream *)piVar1,"and ");
      }
      std::operator<<((ostream *)piVar1,"\'");
      std::operator<<((ostream *)piVar1,
                      (string *)
                      ((long)&((local_b8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar8));
      std::operator<<((ostream *)piVar1,"\'");
      lVar8 = lVar8 + 0x20;
    }
    internal::StringStreamToString(&local_70,(stringstream *)local_a0);
    _Var5._M_current = local_78;
    pbVar9 = local_80;
    poVar7 = local_88;
    if (pAVar3 != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)pAVar3 + 8))(pAVar3);
    }
    std::operator<<(poVar7,(string *)&local_70);
    std::operator<<(poVar7," are reserved by ");
    std::operator<<(poVar7,"Google Test");
    std::operator<<(poVar7,")");
    internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Asyc[P]SocketSys/libs/gtest/googletest/src/gtest.cc"
               ,0x922,"Failed");
    internal::AssertHelper::operator=(&local_c0,(Message *)&local_90);
    internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_98 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::__cxx11::string::~string(local_50);
  return _Var5._M_current == pbVar9;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}